

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O3

wchar_t artifact_power(wchar_t a_idx,char *reason,_Bool verbose)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj_00;
  object *dest;
  object *obj;
  object *known_obj;
  char buf [256];
  object *local_138;
  object *local_130;
  char local_128 [256];
  
  obj_00 = object_new();
  local_138 = obj_00;
  dest = object_new();
  wVar2 = L'\0';
  local_130 = dest;
  file_putf(log_file,"********** Evaluating %s ********\n",reason);
  file_putf(log_file,"Artifact index is %d\n",(ulong)(uint)a_idx);
  _Var1 = make_fake_artifact(obj_00,a_info + a_idx);
  if (_Var1) {
    object_copy(dest,obj_00);
    obj_00->known = dest;
    object_desc(local_128,0x100,obj_00,99,(player *)0x0);
    file_putf(log_file,"%s\n",local_128);
    wVar2 = object_power(local_138,true,log_file);
  }
  object_delete((chunk *)0x0,(chunk *)0x0,&local_130);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_138);
  return wVar2;
}

Assistant:

static int artifact_power(int a_idx, const char *reason, bool verbose)
{
	struct object *obj = object_new();
	struct object *known_obj = object_new();
	char buf[256];
	int32_t power;

	file_putf(log_file, "********** Evaluating %s ********\n", reason);
	file_putf(log_file, "Artifact index is %d\n", a_idx);

	if (!make_fake_artifact(obj, &a_info[a_idx])) {
		object_delete(NULL, NULL, &known_obj);
		object_delete(NULL, NULL, &obj);
		return 0;
	}

	object_copy(known_obj, obj);
	obj->known = known_obj;
	object_desc(buf, 256 * sizeof(char), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, NULL);
	file_putf(log_file, "%s\n", buf);

	power = object_power(obj, verbose, log_file);

	object_delete(NULL, NULL, &known_obj);
	object_delete(NULL, NULL, &obj);
	return power;
}